

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

string * __thiscall
soul::heart::Parser::readQualifiedVariableIdentifier_abi_cxx11_
          (string *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  string local_70;
  char *local_40;
  undefined1 local_38 [8];
  string part1;
  Parser *this_local;
  
  part1.field_2._8_8_ = this;
  readVariableIdentifier_abi_cxx11_((string *)local_38,this);
  local_40 = "::";
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x54d85e);
  if (bVar1) {
    readQualifiedGeneralIdentifier_abi_cxx11_(&local_70,this);
    TokenisedPathString::join(__return_storage_ptr__,(string *)local_38,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_38);
  }
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string readQualifiedVariableIdentifier()
    {
        auto part1 = readVariableIdentifier();

        if (matchIf (HEARTOperator::doubleColon))
            return TokenisedPathString::join (part1, readQualifiedGeneralIdentifier());

        return part1;
    }